

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleMeshShape.cpp
# Opt level: O1

void __thiscall
cbtTriangleMeshShape::getAabb
          (cbtTriangleMeshShape *this,cbtTransform *trans,cbtVector3 *aabbMin,cbtVector3 *aabbMax)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  fVar1 = (this->m_localAabbMax).m_floats[0];
  fVar2 = (this->m_localAabbMin).m_floats[0];
  fVar3 = (this->m_localAabbMax).m_floats[1];
  fVar4 = (this->m_localAabbMin).m_floats[1];
  fVar7 = ((this->m_localAabbMax).m_floats[2] - (this->m_localAabbMin).m_floats[2]) * 0.5;
  fVar17 = fVar7;
  (*(this->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])();
  fVar18 = fVar17;
  (*(this->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])(this);
  fVar19 = fVar18;
  (*(this->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])(this);
  fVar17 = fVar17 + (fVar1 - fVar2) * 0.5;
  fVar18 = fVar18 + (fVar3 - fVar4) * 0.5;
  fVar19 = fVar19 + fVar7;
  fVar3 = ((this->m_localAabbMax).m_floats[0] + (this->m_localAabbMin).m_floats[0]) * 0.5;
  fVar4 = ((this->m_localAabbMax).m_floats[1] + (this->m_localAabbMin).m_floats[1]) * 0.5;
  fVar7 = ((this->m_localAabbMax).m_floats[2] + (this->m_localAabbMin).m_floats[2]) * 0.5;
  fVar1 = (trans->m_basis).m_el[0].m_floats[1];
  auVar13._8_4_ = 0x7fffffff;
  auVar13._0_8_ = 0x7fffffff7fffffff;
  auVar13._12_4_ = 0x7fffffff;
  auVar20 = ZEXT416((uint)(trans->m_basis).m_el[0].m_floats[0]);
  auVar15 = vandps_avx(auVar13,auVar20);
  auVar5 = vandps_avx(auVar13,ZEXT416((uint)fVar1));
  auVar14 = ZEXT416((uint)(trans->m_basis).m_el[0].m_floats[2]);
  auVar6 = vandps_avx(auVar14,auVar13);
  auVar21 = ZEXT416((uint)(trans->m_basis).m_el[1].m_floats[0]);
  auVar16 = vandps_avx(auVar21,auVar13);
  fVar2 = (trans->m_basis).m_el[1].m_floats[1];
  auVar8 = vandps_avx512vl(ZEXT416((uint)fVar2),auVar13);
  auVar22 = ZEXT416((uint)(trans->m_basis).m_el[1].m_floats[2]);
  auVar9 = vandps_avx512vl(auVar22,auVar13);
  auVar23 = ZEXT416((uint)(trans->m_basis).m_el[2].m_floats[0]);
  auVar10 = vandps_avx512vl(auVar23,auVar13);
  auVar24 = ZEXT416((uint)(trans->m_basis).m_el[2].m_floats[1]);
  auVar11 = vandps_avx512vl(auVar24,auVar13);
  auVar25 = ZEXT416((uint)(trans->m_basis).m_el[2].m_floats[2]);
  auVar12 = vandps_avx512vl(auVar25,auVar13);
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar1)),ZEXT416((uint)fVar3),auVar20);
  auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar7),auVar14);
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar4)),ZEXT416((uint)fVar3),auVar21);
  auVar13 = vfmadd231ss_avx512f(auVar13,ZEXT416((uint)fVar7),auVar22);
  auVar14 = vmulss_avx512f(ZEXT416((uint)fVar4),auVar24);
  auVar14 = vfmadd231ss_avx512f(auVar14,ZEXT416((uint)fVar3),auVar23);
  auVar14 = vfmadd231ss_avx512f(auVar14,ZEXT416((uint)fVar7),auVar25);
  fVar1 = auVar20._0_4_ + (trans->m_origin).m_floats[0];
  fVar2 = auVar13._0_4_ + (trans->m_origin).m_floats[1];
  fVar3 = auVar14._0_4_ + (trans->m_origin).m_floats[2];
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar5._0_4_ * fVar18)),ZEXT416((uint)fVar17),auVar15);
  auVar5 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar19),auVar6);
  auVar15 = vmulss_avx512f(ZEXT416((uint)fVar18),auVar8);
  auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar17),auVar16);
  auVar16 = vfmadd231ss_avx512f(auVar15,ZEXT416((uint)fVar19),auVar9);
  auVar15 = vmulss_avx512f(ZEXT416((uint)fVar18),auVar11);
  auVar15 = vfmadd231ss_avx512f(auVar15,ZEXT416((uint)fVar17),auVar10);
  auVar6 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar19),auVar12);
  auVar15 = vinsertps_avx(ZEXT416((uint)(fVar1 - auVar5._0_4_)),
                          ZEXT416((uint)(fVar2 - auVar16._0_4_)),0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416((uint)(fVar3 - auVar6._0_4_)),0x28);
  *(undefined1 (*) [16])aabbMin->m_floats = auVar15;
  auVar15 = vinsertps_avx(ZEXT416((uint)(auVar5._0_4_ + fVar1)),
                          ZEXT416((uint)(auVar16._0_4_ + fVar2)),0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416((uint)(auVar6._0_4_ + fVar3)),0x28);
  *(undefined1 (*) [16])aabbMax->m_floats = auVar15;
  return;
}

Assistant:

void cbtTriangleMeshShape::getAabb(const cbtTransform& trans, cbtVector3& aabbMin, cbtVector3& aabbMax) const
{
	cbtVector3 localHalfExtents = cbtScalar(0.5) * (m_localAabbMax - m_localAabbMin);
	localHalfExtents += cbtVector3(getMargin(), getMargin(), getMargin());
	cbtVector3 localCenter = cbtScalar(0.5) * (m_localAabbMax + m_localAabbMin);

	cbtMatrix3x3 abs_b = trans.getBasis().absolute();

	cbtVector3 center = trans(localCenter);

	cbtVector3 extent = localHalfExtents.dot3(abs_b[0], abs_b[1], abs_b[2]);
	aabbMin = center - extent;
	aabbMax = center + extent;
}